

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hxx
# Opt level: O0

string * trim(string *str)

{
  string *psVar1;
  string *str_local;
  
  psVar1 = rtrim(str);
  psVar1 = ltrim(psVar1);
  return psVar1;
}

Assistant:

static inline string & trim(string & str)
{
  return ltrim(rtrim(str));
}